

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

void google::protobuf::compiler::cpp::ListAllFields
               (Descriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  pointer *pppFVar1;
  iterator iVar2;
  long lVar3;
  long lVar4;
  FieldDescriptor *local_38;
  
  if (0 < *(int *)(d + 0x74)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      ListAllFields((Descriptor *)(*(long *)(d + 0x38) + lVar4),fields);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x90;
    } while (lVar3 < *(int *)(d + 0x74));
  }
  if (0 < *(int *)(d + 0x80)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      local_38 = (FieldDescriptor *)(*(long *)(d + 0x50) + lVar3);
      iVar2._M_current =
           (fields->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (fields->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)fields,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        pppFVar1 = &(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x98;
    } while (lVar4 < *(int *)(d + 0x80));
  }
  if (0 < *(int *)(d + 0x68)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      local_38 = (FieldDescriptor *)(*(long *)(d + 0x28) + lVar3);
      iVar2._M_current =
           (fields->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (fields->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)fields,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        pppFVar1 = &(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x98;
    } while (lVar4 < *(int *)(d + 0x68));
  }
  return;
}

Assistant:

void ListAllFields(const Descriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect sub messages
  for (int i = 0; i < d->nested_type_count(); i++) {
    ListAllFields(d->nested_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
  // Add types of fields necessary
  for (int i = 0; i < d->field_count(); i++) {
    fields->push_back(d->field(i));
  }
}